

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_py_generator.cc
# Opt level: O2

string * t_py_generator::get_real_py_module
                   (string *__return_storage_ptr__,t_program *program,bool gen_twisted,
                   string *package_dir)

{
  undefined7 in_register_00000011;
  string real_module;
  allocator local_79;
  string local_78;
  string local_58;
  string local_38;
  
  if ((int)CONCAT71(in_register_00000011,gen_twisted) != 0) {
    std::__cxx11::string::string((string *)&local_38,"py.twisted",(allocator *)&local_78);
    t_program::get_namespace(__return_storage_ptr__,program,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    if (__return_storage_ptr__->_M_string_length != 0) {
      return __return_storage_ptr__;
    }
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  std::__cxx11::string::string((string *)&local_58,"py",&local_79);
  t_program::get_namespace(&local_78,program,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  if (local_78._M_string_length == 0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&program->name_);
  }
  else {
    std::operator+(__return_storage_ptr__,package_dir,&local_78);
  }
  std::__cxx11::string::~string((string *)&local_78);
  return __return_storage_ptr__;
}

Assistant:

static std::string get_real_py_module(const t_program* program, bool gen_twisted, std::string package_dir="") {
    if (gen_twisted) {
      std::string twisted_module = program->get_namespace("py.twisted");
      if (!twisted_module.empty()) {
        return twisted_module;
      }
    }

    std::string real_module = program->get_namespace("py");
    if (real_module.empty()) {
      return program->get_name();
    }
    return package_dir + real_module;
  }